

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<double> *bVal)

{
  ChNameValue<double> local_30;
  ChNameValue<double> *local_18;
  ChNameValue<double> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<double> *)this;
  ChNameValue<double>::ChNameValue(&local_30,bVal);
  (**(code **)(*(long *)this + 0x20))(this,&local_30);
  ChNameValue<double>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }